

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

void __thiscall MakefileGenerator::writeExtraVariables(MakefileGenerator *this,QTextStream *t)

{
  QChar sep;
  QChar sep_00;
  bool bVar1;
  const_iterator o;
  QTextStream *in_RSI;
  ProString *in_RDI;
  long in_FS_OFFSET;
  ProStringList *exports;
  ProValueMap *vars;
  ConstIterator it;
  QRegularExpression rx;
  ConstIterator exp_it;
  ProStringList outlist;
  ProString *in_stack_fffffffffffffe18;
  QMakeProject *in_stack_fffffffffffffe20;
  undefined6 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2e;
  byte in_stack_fffffffffffffe2f;
  QChar local_18a;
  undefined1 local_188 [30];
  QChar local_16a [13];
  QStringBuilder<const_char_(&)[8],_const_ProKey_&> local_150;
  undefined4 local_c4;
  undefined1 local_c0 [24];
  QRegularExpressionMatch local_a8 [8];
  const_iterator local_a0;
  const_iterator local_98;
  undefined8 local_70;
  QFlags_conflict *local_68;
  undefined8 local_60;
  const_iterator local_58 [7];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ::operator<<((QTextStream *)in_stack_fffffffffffffe20,
               (QTextStreamFunction)in_stack_fffffffffffffe18);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  ProStringList::ProStringList((ProStringList *)0x195bcb);
  QMakeProject::variables((QMakeProject *)0x195beb);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
  QMakeProject::values(in_stack_fffffffffffffe20,(ProKey *)in_stack_fffffffffffffe18);
  ProKey::~ProKey((ProKey *)0x195c4b);
  local_58[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_58[0] = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffffe20);
  while( true ) {
    o = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffffe20);
    bVar1 = QList<ProString>::const_iterator::operator!=(local_58,o);
    if (!bVar1) break;
    local_60 = 0xaaaaaaaaaaaaaaaa;
    QList<ProString>::const_iterator::operator*(local_58);
    ProString::toQString(in_stack_fffffffffffffe18);
    QStringView::QStringView<QString,_true>
              ((QStringView *)in_RDI,
               (QString *)
               CONCAT17(in_stack_fffffffffffffe2f,
                        CONCAT16(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe28)));
    QFlags<QRegularExpression::WildcardConversionOption>::QFlags
              ((QFlags<QRegularExpression::WildcardConversionOption> *)in_stack_fffffffffffffe20,
               (WildcardConversionOption)((ulong)in_stack_fffffffffffffe18 >> 0x20));
    QRegularExpression::fromWildcard((QStringView *)&local_60,(CaseSensitivity)local_70,local_68);
    QString::~QString((QString *)0x195d24);
    local_98._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    local_98._M_node =
         (_Base_ptr)QMap<ProKey,_ProStringList>::begin((QMap<ProKey,_ProStringList> *)in_RDI);
    while( true ) {
      local_a0._M_node =
           (_Base_ptr)QMap<ProKey,_ProStringList>::end((QMap<ProKey,_ProStringList> *)in_RDI);
      bVar1 = ::operator!=((const_iterator *)in_stack_fffffffffffffe20,
                           (const_iterator *)in_stack_fffffffffffffe18);
      if (!bVar1) break;
      QMap<ProKey,_ProStringList>::const_iterator::key((const_iterator *)0x195d82);
      ProString::toQString(in_stack_fffffffffffffe18);
      QFlags<QRegularExpression::MatchOption>::QFlags
                ((QFlags<QRegularExpression::MatchOption> *)in_stack_fffffffffffffe20,
                 (MatchOption)((ulong)in_stack_fffffffffffffe18 >> 0x20));
      QRegularExpression::match(local_a8,&local_60,local_c0,0,0,local_c4);
      in_stack_fffffffffffffe2f = QRegularExpressionMatch::hasMatch();
      QRegularExpressionMatch::~QRegularExpressionMatch(local_a8);
      QString::~QString((QString *)0x195df8);
      if ((in_stack_fffffffffffffe2f & 1) != 0) {
        QMap<ProKey,_ProStringList>::const_iterator::key((const_iterator *)0x195e12);
        local_150 = ::operator+((char (*) [8])in_stack_fffffffffffffe20,
                                (ProKey *)in_stack_fffffffffffffe18);
        ::operator+((QStringBuilder<const_char_(&)[8],_const_ProKey_&> *)in_stack_fffffffffffffe20,
                    (char (*) [4])in_stack_fffffffffffffe18);
        in_stack_fffffffffffffe20 =
             (QMakeProject *)
             QMap<ProKey,_ProStringList>::const_iterator::value((const_iterator *)0x195e5a);
        QChar::QChar<char,_true>(local_16a,' ');
        sep.ucs._1_1_ = in_stack_fffffffffffffe2f;
        sep.ucs._0_1_ = in_stack_fffffffffffffe2e;
        ProStringList::join((ProStringList *)in_stack_fffffffffffffe18,sep);
        ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[8],_const_ProKey_&>,_const_char_(&)[4]>
                     *)CONCAT17(in_stack_fffffffffffffe2f,
                                CONCAT16(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe28)),
                    (QString *)in_stack_fffffffffffffe20);
        ProString::
        ProString<QStringBuilder<QStringBuilder<char_const(&)[8],ProKey_const&>,char_const(&)[4]>,QString>
                  (in_RDI,(QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_const_ProKey_&>,_const_char_(&)[4]>,_QString>
                           *)CONCAT17(in_stack_fffffffffffffe2f,
                                      CONCAT16(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe28))
                  );
        ProStringList::operator<<
                  ((ProStringList *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        ProString::~ProString((ProString *)0x195ed9);
        QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_const_ProKey_&>,_const_char_(&)[4]>,_QString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_const_ProKey_&>,_const_char_(&)[4]>,_QString>
                           *)0x195ee6);
        QString::~QString((QString *)0x195ef3);
      }
      QMap<ProKey,_ProStringList>::const_iterator::operator++
                ((const_iterator *)in_stack_fffffffffffffe20);
    }
    QRegularExpression::~QRegularExpression((QRegularExpression *)&local_60);
    QList<ProString>::const_iterator::operator++(local_58);
  }
  bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x195f33);
  if (!bVar1) {
    QTextStream::operator<<(in_RSI,"####### Custom Variables\n");
    QChar::QChar<char,_true>(&local_18a,'\n');
    sep_00.ucs._1_1_ = in_stack_fffffffffffffe2f;
    sep_00.ucs._0_1_ = in_stack_fffffffffffffe2e;
    ProStringList::join((ProStringList *)in_RSI,sep_00);
    QTextStream::operator<<(in_RSI,(QString *)local_188);
    ::operator<<((QTextStream *)in_stack_fffffffffffffe20,(QTextStreamFunction)in_RSI);
    ::operator<<((QTextStream *)in_stack_fffffffffffffe20,(QTextStreamFunction)in_RSI);
    QString::~QString((QString *)0x195fad);
  }
  ProStringList::~ProStringList((ProStringList *)0x195fba);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
MakefileGenerator::writeExtraVariables(QTextStream &t)
{
    t << Qt::endl;

    ProStringList outlist;
    const ProValueMap &vars = project->variables();
    const ProStringList &exports = project->values("QMAKE_EXTRA_VARIABLES");
    for (ProStringList::ConstIterator exp_it = exports.begin(); exp_it != exports.end(); ++exp_it) {
        auto rx = QRegularExpression::fromWildcard((*exp_it).toQString(), Qt::CaseInsensitive);
        for (ProValueMap::ConstIterator it = vars.begin(); it != vars.end(); ++it) {
            if (rx.match(it.key().toQString()).hasMatch())
                outlist << ("EXPORT_" + it.key() + " = " + it.value().join(' '));
        }
    }
    if (!outlist.isEmpty()) {
        t << "####### Custom Variables\n";
        t << outlist.join('\n') << Qt::endl << Qt::endl;
    }
}